

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

void __thiscall ot::commissioner::persistent_storage::Registry::~Registry(Registry *this)

{
  Close(this);
  if ((this->mManageStorage == true) && (this->mStorage != (PersistentStorage *)0x0)) {
    (*this->mStorage->_vptr_PersistentStorage[1])();
  }
  this->mStorage = (PersistentStorage *)0x0;
  return;
}

Assistant:

Registry::~Registry()
{
    Close();

    if (mManageStorage)
    {
        delete mStorage;
    }
    mStorage = nullptr;
}